

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::
dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
          (dispatch *this,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *funcs,Function_Params *plist,Type_Conversions_State *t_conversions)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type __n;
  element_type *peVar4;
  size_t sVar5;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *this_00;
  const_reference this_01;
  Boxed_Value *this_02;
  Type_Info *ti;
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  *pvVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar7;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  local_f8;
  __normal_iterator<const_std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
  local_f0;
  bad_boxed_cast *anon_var_0;
  arity_error *anon_var_0_1;
  guard_error *anon_var_0_2;
  reference local_c8;
  pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *func_1;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  *__range3;
  size_t i_1;
  ulong local_98;
  size_t i;
  size_t numdiffs;
  size_t local_80;
  int local_74;
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  int arity;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *func;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range2;
  undefined1 local_40 [8];
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ordered_funcs;
  Type_Conversions_State *t_conversions_local;
  Function_Params *plist_local;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *funcs_local;
  
  ordered_funcs.
  super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)t_conversions;
  std::
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ::vector((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
            *)local_40);
  __n = std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
        ::size(funcs);
  std::
  vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
  ::reserve((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
             *)local_40,__n);
  __end0 = std::
           vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ::begin(funcs);
  func = (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
         std::
         vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
         ::end(funcs);
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                           (&__end0,(__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                                     *)&func), ((bVar2 ^ 0xffU) & 1) != 0) {
    p_Stack_70 = &__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  ::operator*(&__end0)->
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
    ;
    peVar4 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Stack_70);
    iVar3 = Proxy_Function_Base::get_arity(peVar4);
    local_74 = iVar3;
    if (iVar3 == -1) {
      local_80 = Function_Params::size(plist);
      numdiffs = (size_t)std::
                         __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                         ::get(p_Stack_70);
      std::
      vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
      ::emplace_back<unsigned_long,chaiscript::dispatch::Proxy_Function_Base*>
                ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                  *)local_40,&local_80,(Proxy_Function_Base **)&numdiffs);
    }
    else {
      sVar5 = Function_Params::size(plist);
      if (iVar3 == (int)sVar5) {
        i = 0;
        for (local_98 = 0; uVar1 = local_98, sVar5 = Function_Params::size(plist), uVar1 < sVar5;
            local_98 = local_98 + 1) {
          peVar4 = std::
                   __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)p_Stack_70);
          this_00 = Proxy_Function_Base::get_param_types(peVar4);
          this_01 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                    operator[](this_00,local_98 + 1);
          this_02 = Function_Params::operator[](plist,local_98);
          ti = Boxed_Value::get_type_info(this_02);
          bVar2 = Type_Info::bare_equal(this_01,ti);
          if (!bVar2) {
            i = i + 1;
          }
        }
        i_1 = (size_t)std::
                      __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                      ::get(p_Stack_70);
        std::
        vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
        ::emplace_back<unsigned_long&,chaiscript::dispatch::Proxy_Function_Base*>
                  ((vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>
                    *)local_40,&i,(Proxy_Function_Base **)&i_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
    ::operator++(&__end0);
  }
  __range3 = (vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
              *)0x0;
  do {
    pvVar6 = (vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
              *)Function_Params::size(plist);
    if (pvVar6 < __range3) {
      local_f0._M_current =
           (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
           std::
           vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
           ::cbegin((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                     *)local_40);
      local_f8._M_current =
           (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
           std::
           vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
           ::cend((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                   *)local_40);
      detail::
      dispatch_with_conversions<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>const*,std::vector<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>,std::allocator<std::pair<unsigned_long,chaiscript::dispatch::Proxy_Function_Base_const*>>>>,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                ((detail *)this,local_f0,&local_f8,plist,
                 (Type_Conversions_State *)
                 ordered_funcs.
                 super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,funcs);
LAB_0056f8f9:
      anon_var_0_2._4_4_ = 1;
      std::
      vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
      ::~vector((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                 *)local_40);
      BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = extraout_RDX._M_pi;
      BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar7.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    __end3 = std::
             vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
             ::begin((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                      *)local_40);
    func_1 = (pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*> *)
             std::
             vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
             ::end((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                    *)local_40);
    while (bVar2 = __gnu_cxx::
                   operator==<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                             (&__end3,(__normal_iterator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                                       *)&func_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
                 ::operator*(&__end3);
      if (((vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
            *)local_c8->first == __range3) &&
         ((__range3 ==
           (vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
            *)0x0 ||
          (bVar2 = Proxy_Function_Base::filter
                             (local_c8->second,plist,
                              (Type_Conversions_State *)
                              ordered_funcs.
                              super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)))) {
        Proxy_Function_Base::operator()
                  ((Proxy_Function_Base *)this,(Function_Params *)local_c8->second,
                   (Type_Conversions_State *)plist);
        goto LAB_0056f8f9;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_*,_std::vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>_>
      ::operator++(&__end3);
    }
    __range3 = (vector<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                *)((long)&(__range3->
                          super__Vector_base<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>,_std::allocator<std::pair<unsigned_long,_const_chaiscript::dispatch::Proxy_Function_Base_*>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

Boxed_Value dispatch(const Funcs &funcs, const Function_Params &plist, const Type_Conversions_State &t_conversions) {
      std::vector<std::pair<size_t, const Proxy_Function_Base *>> ordered_funcs;
      ordered_funcs.reserve(funcs.size());

      for (const auto &func : funcs) {
        const auto arity = func->get_arity();

        if (arity == -1) {
          ordered_funcs.emplace_back(plist.size(), func.get());
        } else if (arity == static_cast<int>(plist.size())) {
          size_t numdiffs = 0;
          for (size_t i = 0; i < plist.size(); ++i) {
            if (!func->get_param_types()[i + 1].bare_equal(plist[i].get_type_info())) {
              ++numdiffs;
            }
          }
          ordered_funcs.emplace_back(numdiffs, func.get());
        }
      }

      for (size_t i = 0; i <= plist.size(); ++i) {
        for (const auto &func : ordered_funcs) {
          try {
            if (func.first == i && (i == 0 || func.second->filter(plist, t_conversions))) {
              return (*(func.second))(plist, t_conversions);
            }
          } catch (const exception::bad_boxed_cast &) {
            // parameter failed to cast, try again
          } catch (const exception::arity_error &) {
            // invalid num params, try again
          } catch (const exception::guard_error &) {
            // guard failed to allow the function to execute,
            // try again
          }
        }
      }

      return detail::dispatch_with_conversions(ordered_funcs.cbegin(), ordered_funcs.cend(), plist, t_conversions, funcs);
    }